

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O1

void __thiscall slang::ast::EvalContext::addDiags(EvalContext *this,Diagnostics *additional)

{
  size_type sVar1;
  bool bVar2;
  long lVar3;
  vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *__x;
  Diagnostic copy;
  Diagnostic local_a0;
  
  sVar1 = (additional->super_SmallVector<slang::Diagnostic,_2UL>).
          super_SmallVectorBase<slang::Diagnostic>.len;
  if (sVar1 != 0) {
    lVar3 = sVar1 * 0x70;
    __x = &((additional->super_SmallVector<slang::Diagnostic,_2UL>).
            super_SmallVectorBase<slang::Diagnostic>.data_)->notes;
    bVar2 = true;
    do {
      if (bVar2) {
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
        ::vector(&local_a0.args,
                 (vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                  *)(__x + -2));
        std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
                  (&local_a0.ranges,
                   (vector<slang::SourceRange,_std::allocator<slang::SourceRange>_> *)(__x + -1));
        std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
                  (&local_a0.notes,__x);
        local_a0.symbol = *(Symbol **)((SourceLocation *)(__x + 2) + 1);
        local_a0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload =
             *(_Storage<unsigned_long,_true> *)(__x + 1);
        local_a0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged =
             (((optional<unsigned_long> *)(__x + 1))->
             super__Optional_base<unsigned_long,_true,_true>)._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        local_a0.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._9_7_ =
             *(undefined7 *)
              &(((optional<unsigned_long> *)(__x + 1))->
               super__Optional_base<unsigned_long,_true,_true>)._M_payload.
               super__Optional_payload_base<unsigned_long>.field_0x9;
        local_a0._88_8_ =
             *(undefined8 *)&((DiagCode *)((optional<unsigned_long> *)(__x + 1) + 1))->subsystem;
        local_a0.location = *(SourceLocation *)(__x + 2);
        reportStack(this,&local_a0);
        SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                  ((SmallVectorBase<slang::Diagnostic> *)&this->diags,&local_a0);
        std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_a0.notes)
        ;
        if (local_a0.ranges.
            super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a0.ranges.
                                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.ranges.
                                super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
        ::~vector(&local_a0.args);
        bVar2 = false;
      }
      else {
        SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic_const&>
                  ((SmallVectorBase<slang::Diagnostic> *)&this->diags,(Diagnostic *)(__x + -2));
      }
      __x = (vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
            ((long)(__x + 4) + 0x10);
      lVar3 = lVar3 + -0x70;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void EvalContext::addDiags(const Diagnostics& additional) {
    bool first = true;
    for (auto& diag : additional) {
        if (first) {
            Diagnostic copy = diag;
            reportStack(copy);
            diags.emplace_back(std::move(copy));
            first = false;
        }
        else {
            diags.push_back(diag);
        }
    }
}